

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unroller.cpp
# Opt level: O2

void __thiscall
spvtools::opt::anon_unknown_0::LoopUnrollerUtilsImpl::RemapOperands
          (LoopUnrollerUtilsImpl *this,Instruction *inst)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  local_38._8_8_ = 0;
  local_20 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp:903:36)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(unsigned_int_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/loop_unroller.cpp:903:36)>
             ::_M_manager;
  local_38._M_unused._M_object = this;
  Instruction::ForEachInId(inst,(function<void_(unsigned_int_*)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  IRContext::AnalyzeUses(this->context_,inst);
  return;
}

Assistant:

void LoopUnrollerUtilsImpl::RemapOperands(Instruction* inst) {
  auto remap_operands_to_new_ids = [this](uint32_t* id) {
    auto itr = state_.new_inst.find(*id);

    if (itr != state_.new_inst.end()) {
      *id = itr->second;
    }
  };

  inst->ForEachInId(remap_operands_to_new_ids);
  context_->AnalyzeUses(inst);
}